

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall cmFindPackageCommand::StoreVersionFound(cmFindPackageCommand *this)

{
  cmMakefile *pcVar1;
  ulong uVar2;
  char *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  char local_88 [8];
  char buf [64];
  undefined1 local_30 [8];
  string ver;
  cmFindPackageCommand *this_local;
  
  ver.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30,(string *)&this->Name);
  std::__cxx11::string::operator+=((string *)local_30,"_VERSION");
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
    value = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(pcVar1,(string *)local_30,value);
  }
  else {
    cmMakefile::RemoveDefinition
              ((this->super_cmFindCommon).super_cmCommand.Makefile,(string *)local_30);
  }
  sprintf(local_88,"%u",(ulong)this->VersionFoundMajor);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::operator+(&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 "_MAJOR");
  cmMakefile::AddDefinition(pcVar1,&local_a8,local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  sprintf(local_88,"%u",(ulong)this->VersionFoundMinor);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::operator+(&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 "_MINOR");
  cmMakefile::AddDefinition(pcVar1,&local_c8,local_88);
  std::__cxx11::string::~string((string *)&local_c8);
  sprintf(local_88,"%u",(ulong)this->VersionFoundPatch);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::operator+(&local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 "_PATCH");
  cmMakefile::AddDefinition(pcVar1,&local_e8,local_88);
  std::__cxx11::string::~string((string *)&local_e8);
  sprintf(local_88,"%u",(ulong)this->VersionFoundTweak);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::operator+(&local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 "_TWEAK");
  cmMakefile::AddDefinition(pcVar1,&local_108,local_88);
  std::__cxx11::string::~string((string *)&local_108);
  sprintf(local_88,"%u",(ulong)this->VersionFoundCount);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::operator+(&local_128,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 "_COUNT");
  cmMakefile::AddDefinition(pcVar1,&local_128,local_88);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmFindPackageCommand::StoreVersionFound()
{
  // Store the whole version string.
  std::string ver = this->Name;
  ver += "_VERSION";
  if (this->VersionFound.empty()) {
    this->Makefile->RemoveDefinition(ver);
  } else {
    this->Makefile->AddDefinition(ver, this->VersionFound.c_str());
  }

  // Store the version components.
  char buf[64];
  sprintf(buf, "%u", this->VersionFoundMajor);
  this->Makefile->AddDefinition(ver + "_MAJOR", buf);
  sprintf(buf, "%u", this->VersionFoundMinor);
  this->Makefile->AddDefinition(ver + "_MINOR", buf);
  sprintf(buf, "%u", this->VersionFoundPatch);
  this->Makefile->AddDefinition(ver + "_PATCH", buf);
  sprintf(buf, "%u", this->VersionFoundTweak);
  this->Makefile->AddDefinition(ver + "_TWEAK", buf);
  sprintf(buf, "%u", this->VersionFoundCount);
  this->Makefile->AddDefinition(ver + "_COUNT", buf);
}